

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  __m128i *palVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar16;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *palVar17;
  __m128i *b_02;
  __m128i *palVar18;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *palVar19;
  long lVar20;
  longlong lVar21;
  uint uVar22;
  __m128i *palVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  uint uVar28;
  ulong size;
  __m128i *palVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  __m128i *palVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  __m128i *ptr;
  __m128i *ptr_00;
  bool bVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  longlong lVar48;
  undefined4 uVar55;
  undefined1 extraout_XMM0 [16];
  long lVar56;
  long lVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined4 uVar58;
  longlong lVar59;
  undefined4 uVar60;
  __m128i_64_t B_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined4 uVar63;
  __m128i_64_t B_4;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  __m128i_64_t B_3;
  longlong lVar68;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  __m128i_64_t B_5;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128i_64_t B;
  undefined1 auVar78 [16];
  long lVar81;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar82;
  __m128i_64_t B_6;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar85;
  long lVar87;
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  long lVar91;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  int32_t column_len;
  __m128i_64_t B_7;
  __m128i *local_200;
  __m128i *local_1f8;
  __m128i *local_1f0;
  __m128i *local_1d8;
  __m128i *local_1d0;
  __m128i *local_1c8;
  __m128i *local_1c0;
  __m128i *local_1b8;
  long local_1b0;
  __m128i *local_1a8;
  longlong local_138;
  undefined1 local_a8 [16];
  ulong uStack_90;
  ulong uStack_80;
  long local_68;
  long lStack_60;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar36 = profile->s1Len;
        uVar15 = (ulong)uVar36;
        if ((int)uVar36 < 1) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_rowcol_striped_profile_sse41_128_64_cold_1();
        }
        else {
          uVar32 = uVar15 + 1;
          size = uVar32 >> 1;
          uVar28 = (uint)size;
          iVar13 = (int)(uVar36 - 1) / (int)uVar28;
          uVar43 = (int)(uVar36 - 1) % (int)uVar28;
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          iVar39 = ppVar5->max;
          result = parasail_result_new_rowcol3((uint)uVar32 & 0x7ffffffe,s2Len);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x2850804;
            b = parasail_memalign___m128i(0x10,size);
            palVar16 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            local_1c8 = parasail_memalign___m128i(0x10,size);
            b_01 = parasail_memalign___m128i(0x10,size);
            palVar17 = parasail_memalign___m128i(0x10,size);
            b_02 = parasail_memalign___m128i(0x10,size);
            palVar18 = parasail_memalign___m128i(0x10,size);
            b_03 = parasail_memalign___m128i(0x10,size);
            b_04 = parasail_memalign___m128i(0x10,size);
            b_05 = parasail_memalign___m128i(0x10,size);
            b_06 = parasail_memalign___m128i(0x10,size);
            local_1d0 = parasail_memalign___m128i(0x10,size);
            local_1b8 = parasail_memalign___m128i(0x10,size);
            local_1d8 = parasail_memalign___m128i(0x10,size);
            palVar19 = parasail_memalign___m128i(0x10,size);
            if (b == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar16 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_1c8 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar17 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar18 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_04 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_05 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_06 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_1d0 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_1b8 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_1d8 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar19 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar45 = (ulong)(uint)gap;
            c[1] = (longlong)b_03;
            c[0] = size;
            palVar23 = b_06;
            parasail_memset___m128i(b,c,(size_t)b_06);
            c_00[1] = extraout_RDX;
            c_00[0] = size;
            parasail_memset___m128i(b_00,c_00,(size_t)palVar23);
            c_01[1] = extraout_RDX_00;
            c_01[0] = size;
            parasail_memset___m128i(b_01,c_01,(size_t)palVar23);
            c_02[1] = extraout_RDX_01;
            c_02[0] = size;
            parasail_memset___m128i(b_02,c_02,(size_t)palVar23);
            c_03[1] = extraout_RDX_02;
            c_03[0] = size;
            parasail_memset___m128i(b_03,c_03,(size_t)palVar23);
            c_04[1] = extraout_RDX_03;
            c_04[0] = size;
            parasail_memset___m128i(b_04,c_04,(size_t)palVar23);
            c_05[1] = extraout_RDX_04;
            c_05[0] = size;
            parasail_memset___m128i(b_05,c_05,(size_t)palVar23);
            pmovsxbq(extraout_XMM0,0x101);
            c_06[1] = extraout_RDX_05;
            c_06[0] = size;
            parasail_memset___m128i(b_06,c_06,(size_t)palVar23);
            uVar22 = uVar28 - 1;
            uVar38 = 0;
            uVar40 = 0;
            local_138 = 0;
            local_1b0 = -0x4000000000000000;
            lVar31 = 0;
            lVar25 = 0;
            local_a8 = (undefined1  [16])0x0;
            lVar27 = 0;
            lVar35 = 0;
            do {
              local_1f0 = b_01;
              local_1c0 = b;
              local_1f8 = b_02;
              palVar29 = b_00;
              lVar59 = local_1c0[uVar22][0];
              lVar21 = palVar29[uVar22][0];
              local_1a8 = local_1f0;
              lVar48 = local_1f0[uVar22][0];
              lVar68 = local_1f8[uVar22][0];
              lVar46 = 0;
              lVar41 = (long)ppVar5->mapper[(byte)s2[uVar38]] * (long)(int)uVar28 * 0x10;
              iVar33 = (int)uVar38 + -2;
              bVar44 = (int)uVar40 == iVar33;
              palVar37 = local_1b8;
              palVar23 = palVar19;
              if (bVar44) {
                palVar37 = local_1c8;
                palVar23 = palVar18;
              }
              lVar91 = 0;
              b_02 = palVar18;
              if (bVar44) {
                b_02 = palVar19;
              }
              lVar30 = 0;
              b_01 = palVar17;
              if (bVar44) {
                b_01 = local_1d8;
              }
              lVar42 = 0;
              b = palVar16;
              b_00 = local_1c8;
              if (bVar44) {
                b = local_1d0;
                b_00 = local_1b8;
              }
              lVar20 = 0;
              auVar84 = ZEXT816(0);
              auVar77 = ZEXT816(0);
              auVar78 = (undefined1  [16])0x0;
              auVar71 = _DAT_008d0e90;
              lVar82 = lVar27;
              lVar26 = lVar35;
              do {
                plVar1 = (long *)((long)*b_03 + lVar20);
                lVar47 = *plVar1;
                lVar57 = plVar1[1];
                lVar27 = *(long *)((long)*b_03 + lVar20);
                lVar35 = *(long *)((long)*b_03 + lVar20 + 8);
                auVar62 = *(undefined1 (*) [16])((long)*b_04 + lVar20);
                auVar64 = *(undefined1 (*) [16])((long)*b_05 + lVar20);
                plVar1 = (long *)((long)pvVar4 + lVar20 + lVar41);
                lVar46 = lVar46 + *plVar1;
                lVar56 = lVar59 + plVar1[1];
                if (lVar46 < 1) {
                  lVar46 = 0;
                }
                auVar67 = *(undefined1 (*) [16])((long)*b_06 + lVar20);
                if (lVar56 < 1) {
                  lVar56 = 0;
                }
                lVar85 = lVar46;
                if (lVar46 <= lVar27) {
                  lVar85 = lVar27;
                }
                lVar87 = lVar56;
                if (lVar56 <= lVar35) {
                  lVar87 = lVar35;
                }
                lVar24 = auVar78._0_8_;
                if (lVar85 <= lVar24) {
                  lVar85 = lVar24;
                }
                lVar81 = auVar78._8_8_;
                if (lVar87 <= lVar81) {
                  lVar87 = lVar81;
                }
                plVar1 = (long *)((long)*b + lVar20);
                *plVar1 = lVar85;
                plVar1[1] = lVar87;
                auVar61._0_8_ = -(ulong)(lVar85 == lVar24);
                auVar61._8_8_ = -(ulong)(lVar87 == lVar81);
                auVar78 = blendvpd(auVar62,auVar77,auVar61);
                plVar1 = (long *)((long)pvVar6 + lVar20 + lVar41);
                auVar74._0_8_ = lVar91 + *plVar1;
                auVar74._8_8_ = lVar21 + plVar1[1];
                auVar79._0_8_ = -(ulong)(lVar46 == lVar85);
                auVar79._8_8_ = -(ulong)(lVar56 == lVar87);
                auVar74 = blendvpd(auVar78,auVar74,auVar79);
                auVar88._0_8_ = -(ulong)(lVar85 == 0);
                auVar88._8_8_ = -(ulong)(lVar87 == 0);
                auVar74 = ~auVar88 & auVar74;
                auVar78 = blendvpd(auVar64,auVar84,auVar61);
                *(undefined1 (*) [16])((long)*b_00 + lVar20) = auVar74;
                plVar1 = (long *)((long)pvVar7 + lVar20 + lVar41);
                auVar75._0_8_ = lVar30 + *plVar1;
                auVar75._8_8_ = lVar48 + plVar1[1];
                auVar75 = blendvpd(auVar78,auVar75,auVar79);
                auVar78 = blendvpd(auVar67,auVar71,auVar61);
                auVar76._8_4_ = 0xffffffff;
                auVar76._0_8_ = 0xffffffffffffffff;
                auVar76._12_4_ = 0xffffffff;
                auVar66._0_8_ = lVar42 + 1;
                auVar66._8_8_ = lVar68 - auVar76._8_8_;
                auVar78 = blendvpd(auVar78,auVar66,auVar79);
                lVar27 = auVar74._0_8_;
                if (auVar74._0_8_ < lVar31) {
                  lVar27 = lVar31;
                }
                auVar75 = ~auVar88 & auVar75;
                lVar35 = auVar74._8_8_;
                if (auVar74._8_8_ < lVar25) {
                  lVar35 = lVar25;
                }
                if (lVar27 <= auVar75._0_8_) {
                  lVar27 = auVar75._0_8_;
                }
                auVar78 = ~auVar88 & auVar78;
                if (lVar35 <= auVar75._8_8_) {
                  lVar35 = auVar75._8_8_;
                }
                lVar46 = auVar78._0_8_;
                lVar31 = lVar27;
                if (lVar27 <= lVar46) {
                  lVar31 = lVar46;
                }
                lVar91 = auVar78._8_8_;
                lVar25 = lVar35;
                if (lVar35 <= lVar91) {
                  lVar25 = lVar91;
                }
                lVar27 = lVar85;
                if (lVar85 <= lVar82) {
                  lVar27 = lVar82;
                }
                lVar35 = lVar87;
                if (lVar87 <= lVar26) {
                  lVar35 = lVar26;
                }
                uStack_80 = (ulong)(uint)open;
                lVar85 = lVar85 - (ulong)(uint)open;
                lVar87 = lVar87 - uStack_80;
                uStack_90 = (ulong)(uint)gap;
                lVar47 = lVar47 - uVar45;
                lVar57 = lVar57 - uStack_90;
                lVar30 = lVar47;
                if (lVar47 < lVar85) {
                  lVar30 = lVar85;
                }
                lVar42 = lVar57;
                if (lVar57 < lVar87) {
                  lVar42 = lVar87;
                }
                lVar24 = lVar24 - uVar45;
                lVar81 = lVar81 - uStack_90;
                lVar82 = lVar24;
                if (lVar24 < lVar85) {
                  lVar82 = lVar85;
                }
                lVar26 = lVar81;
                if (lVar81 < lVar87) {
                  lVar26 = lVar87;
                }
                auVar49._8_8_ = -(ulong)(lVar57 < lVar87);
                auVar49._0_8_ = -(ulong)(lVar47 < lVar85);
                auVar76 = pblendvb(auVar62,auVar74,auVar49);
                auVar79 = pblendvb(auVar64,auVar75,auVar49);
                *(undefined1 (*) [16])((long)*b_01 + lVar20) = auVar75;
                *(undefined1 (*) [16])((long)*b_02 + lVar20) = auVar78;
                local_68 = auVar67._0_8_;
                lStack_60 = auVar67._8_8_;
                auVar67._8_4_ = 0xffffffff;
                auVar67._0_8_ = 0xffffffffffffffff;
                auVar67._12_4_ = 0xffffffff;
                auVar64._0_8_ = local_68 + 1;
                auVar64._8_8_ = lStack_60 - auVar67._8_8_;
                auVar89._0_8_ = lVar46 + 1;
                auVar89._8_8_ = lVar91 - auVar67._8_8_;
                auVar86._8_4_ = 0xffffffff;
                auVar86._0_8_ = 0xffffffffffffffff;
                auVar86._12_4_ = 0xffffffff;
                auVar78 = pblendvb(auVar64,auVar89,auVar49);
                auVar62._8_8_ = -(ulong)(lVar81 < lVar87);
                auVar62._0_8_ = -(ulong)(lVar24 < lVar85);
                auVar77 = pblendvb(auVar77,auVar74,auVar62);
                plVar1 = (long *)((long)*b_03 + lVar20);
                *plVar1 = lVar30;
                plVar1[1] = lVar42;
                *(undefined1 (*) [16])((long)*b_04 + lVar20) = auVar76;
                *(undefined1 (*) [16])((long)*b_05 + lVar20) = auVar79;
                *(undefined1 (*) [16])((long)*b_06 + lVar20) = auVar78;
                auVar78._8_8_ = lVar26;
                auVar78._0_8_ = lVar82;
                auVar84 = pblendvb(auVar84,auVar75,auVar62);
                auVar70._0_8_ = auVar71._0_8_ + 1;
                auVar70._8_8_ = auVar71._8_8_ - auVar86._8_8_;
                auVar71 = pblendvb(auVar70,auVar89,auVar62);
                plVar1 = (long *)((long)*local_1c0 + lVar20);
                lVar46 = *plVar1;
                lVar59 = plVar1[1];
                plVar1 = (long *)((long)*palVar29 + lVar20);
                lVar91 = *plVar1;
                lVar21 = plVar1[1];
                plVar1 = (long *)((long)*local_1f0 + lVar20);
                lVar30 = *plVar1;
                lVar48 = plVar1[1];
                plVar1 = (long *)((long)*local_1f8 + lVar20);
                lVar42 = *plVar1;
                lVar68 = plVar1[1];
                lVar20 = lVar20 + 0x10;
                lVar82 = lVar27;
                lVar26 = lVar35;
              } while (size << 4 != lVar20);
              if ((int)uVar40 == iVar33) {
                local_1d0 = palVar16;
                local_1d8 = palVar17;
              }
              auVar90._8_4_ = 0xffffffff;
              auVar90._0_8_ = 0xffffffffffffffff;
              auVar90._12_4_ = 0xffffffff;
              iVar33 = 0;
              do {
                lVar59 = local_1c0[uVar22][0];
                lVar46 = 0;
                auVar80._0_8_ = auVar78._0_8_;
                auVar80._8_4_ = auVar78._0_4_;
                auVar80._12_4_ = auVar78._4_4_;
                auVar78._8_8_ = auVar80._8_8_;
                auVar78._0_8_ = (long)-open;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = auVar77._0_8_;
                auVar77 = auVar9 << 0x40;
                auVar10._8_8_ = 0;
                auVar10._0_8_ = auVar84._0_8_;
                auVar84 = auVar10 << 0x40;
                auVar72._0_8_ = auVar71._0_8_;
                auVar72._8_4_ = auVar71._0_4_;
                auVar72._12_4_ = auVar71._4_4_;
                auVar71._8_8_ = auVar72._8_8_;
                auVar71._0_8_ = 1;
                lVar42 = 0;
                lVar91 = lVar27;
                lVar30 = lVar35;
                do {
                  plVar1 = (long *)((long)pvVar4 + lVar42 + lVar41);
                  lVar46 = lVar46 + *plVar1;
                  lVar59 = lVar59 + plVar1[1];
                  if (lVar46 < 1) {
                    lVar46 = 0;
                  }
                  if (lVar59 < 1) {
                    lVar59 = 0;
                  }
                  lVar26 = auVar78._0_8_;
                  lVar27 = *(long *)((long)*b + lVar42);
                  lVar82 = lVar26;
                  if (lVar26 < lVar27) {
                    lVar82 = lVar27;
                  }
                  lVar47 = auVar78._8_8_;
                  lVar27 = *(long *)((long)*b + lVar42 + 8);
                  lVar20 = lVar47;
                  if (lVar47 < lVar27) {
                    lVar20 = lVar27;
                  }
                  plVar1 = (long *)((long)*b + lVar42);
                  *plVar1 = lVar82;
                  plVar1[1] = lVar20;
                  auVar51._0_8_ = -(ulong)(lVar82 == lVar26);
                  auVar51._8_8_ = -(ulong)(lVar20 == lVar47);
                  auVar50._0_8_ = -(ulong)(lVar82 == lVar46);
                  auVar50._8_8_ = -(ulong)(lVar20 == lVar59);
                  auVar51 = ~auVar50 & auVar51;
                  auVar62 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar42),auVar77,auVar51);
                  *(undefined1 (*) [16])((long)*b_00 + lVar42) = auVar62;
                  auVar67 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar42),auVar84,auVar51);
                  *(undefined1 (*) [16])((long)*b_01 + lVar42) = auVar67;
                  auVar64 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar42),auVar71,auVar51);
                  lVar27 = auVar62._0_8_;
                  if (auVar62._0_8_ < lVar31) {
                    lVar27 = lVar31;
                  }
                  lVar35 = auVar62._8_8_;
                  if (auVar62._8_8_ < lVar25) {
                    lVar35 = lVar25;
                  }
                  if (lVar27 <= auVar67._0_8_) {
                    lVar27 = auVar67._0_8_;
                  }
                  if (lVar35 <= auVar67._8_8_) {
                    lVar35 = auVar67._8_8_;
                  }
                  lVar57 = auVar64._0_8_;
                  lVar31 = lVar27;
                  if (lVar27 <= lVar57) {
                    lVar31 = lVar57;
                  }
                  lVar56 = auVar64._8_8_;
                  lVar25 = lVar35;
                  if (lVar35 <= lVar56) {
                    lVar25 = lVar56;
                  }
                  lVar27 = lVar82;
                  if (lVar82 <= lVar91) {
                    lVar27 = lVar91;
                  }
                  lVar35 = lVar20;
                  if (lVar20 <= lVar30) {
                    lVar35 = lVar30;
                  }
                  lVar82 = lVar82 - (ulong)(uint)open;
                  lVar20 = lVar20 - uStack_80;
                  auVar69._0_8_ = lVar26 - uVar45;
                  auVar69._8_8_ = lVar47 - uStack_90;
                  *(undefined1 (*) [16])((long)*b_02 + lVar42) = auVar64;
                  auVar53._8_8_ = -(ulong)(lVar20 < auVar69._8_8_);
                  auVar53._0_8_ = -(ulong)(lVar82 < auVar69._0_8_);
                  auVar83._0_8_ = -(ulong)(lVar82 == auVar69._0_8_);
                  auVar83._8_8_ = -(ulong)(lVar20 == auVar69._8_8_);
                  auVar52._8_8_ = -(ulong)(0 < auVar69._8_8_);
                  auVar52._0_8_ = -(ulong)(0 < auVar69._0_8_);
                  auVar53 = auVar52 & auVar83 | auVar53;
                  if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar53[0xf]) {
                    iVar14 = 0x1e;
                  }
                  else {
                    auVar54._8_8_ = -(ulong)(auVar69._8_8_ < lVar20);
                    auVar54._0_8_ = -(ulong)(auVar69._0_8_ < lVar82);
                    auVar77 = pblendvb(auVar77,auVar62,auVar54);
                    auVar84 = pblendvb(auVar84,auVar67,auVar54);
                    auVar73._0_8_ = auVar71._0_8_ + 1;
                    auVar73._8_8_ = auVar71._8_8_ - auVar90._8_8_;
                    auVar65._0_8_ = lVar57 + 1;
                    auVar65._8_8_ = lVar56 - auVar90._8_8_;
                    auVar71 = pblendvb(auVar73,auVar65,auVar54);
                    plVar1 = (long *)((long)*local_1c0 + lVar42);
                    lVar46 = *plVar1;
                    lVar59 = plVar1[1];
                    iVar14 = 0;
                    auVar78 = auVar69;
                  }
                  if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar53[0xf]) goto LAB_00714cda;
                  lVar42 = lVar42 + 0x10;
                  lVar91 = lVar27;
                  lVar30 = lVar35;
                } while (size << 4 != lVar42);
                iVar14 = 0;
LAB_00714cda:
                if (iVar14 != 0) {
                  if (iVar14 != 0x1e) {
                    bVar44 = false;
                    goto LAB_00714e77;
                  }
                  break;
                }
                bVar44 = iVar33 == 0;
                iVar33 = iVar33 + 1;
              } while (bVar44);
              lVar59 = b[uVar43][0];
              uVar63 = (undefined4)b[uVar43][1];
              lVar68 = b_00[uVar43][0];
              uVar60 = (undefined4)b_00[uVar43][1];
              lVar21 = b_01[uVar43][0];
              uVar58 = (undefined4)b_01[uVar43][1];
              lVar48 = b_02[uVar43][0];
              uVar55 = (undefined4)b_02[uVar43][1];
              if (iVar13 < 1) {
                do {
                  uVar55 = (undefined4)lVar48;
                  uVar58 = (undefined4)lVar21;
                  uVar60 = (undefined4)lVar68;
                  uVar63 = (undefined4)lVar59;
                  lVar59 = 0;
                  lVar68 = 0;
                  lVar21 = 0;
                  lVar48 = 0;
                } while (iVar13 < 0);
              }
              *(undefined4 *)(*((result->field_4).trace)->trace_del_table + uVar38 * 4) = uVar63;
              *(undefined4 *)
               (*(long *)((long)((result->field_4).trace)->trace_del_table + 8) + uVar38 * 4) =
                   uVar60;
              *(undefined4 *)
               (*(long *)((long)((result->field_4).trace)->trace_del_table + 0x10) + uVar38 * 4) =
                   uVar58;
              *(undefined4 *)
               (*(long *)((long)((result->field_4).trace)->trace_del_table + 0x18) + uVar38 * 4) =
                   uVar55;
              uVar34 = -(ulong)((long)local_a8._8_8_ < lVar35);
              auVar77._8_8_ = uVar34;
              auVar77._0_8_ = -(ulong)((long)local_a8._0_8_ < lVar27);
              bVar44 = true;
              if ((((((((((((((((auVar77 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar77 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar77 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar77 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar77 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar77 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (uVar34 >> 7 & 1) != 0) || (uVar34 >> 0xf & 1) != 0) ||
                      (uVar34 >> 0x17 & 1) != 0) || (uVar34 >> 0x1f & 1) != 0) ||
                    (uVar34 >> 0x27 & 1) != 0) || (uVar34 >> 0x2f & 1) != 0) ||
                  (uVar34 >> 0x37 & 1) != 0) || (long)local_a8._8_8_ < lVar35) {
                local_1b0 = lVar35;
                if (lVar35 < lVar27) {
                  local_1b0 = lVar27;
                }
                if ((long)(~(long)iVar39 + 0x7fffffffffffffffU) < local_1b0) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                  bVar44 = false;
                }
                else {
                  local_a8._8_4_ = (int)local_1b0;
                  local_a8._0_8_ = local_1b0;
                  local_a8._12_4_ = (int)((ulong)local_1b0 >> 0x20);
                  uVar40 = uVar38 & 0xffffffff;
                }
              }
LAB_00714e77:
              iVar33 = (int)uVar38;
              local_1c8 = palVar29;
              if ((!bVar44) ||
                 (uVar38 = uVar38 + 1, palVar18 = local_1f8, palVar19 = palVar23,
                 palVar17 = local_1f0, palVar16 = local_1c0, iVar33 = s2Len, local_1b8 = palVar37,
                 uVar38 == (uint)s2Len)) {
                lVar35 = size * 4;
                lVar27 = 0;
                do {
                  puVar2 = (undefined4 *)((long)*b + lVar27 * 4);
                  uVar63 = puVar2[2];
                  puVar3 = (undefined4 *)((long)*b_00 + lVar27 * 4);
                  uVar58 = *puVar3;
                  uVar55 = puVar3[2];
                  auVar71 = *(undefined1 (*) [16])((long)*b_01 + lVar27 * 4);
                  puVar3 = (undefined4 *)((long)*b_02 + lVar27 * 4);
                  uVar60 = *puVar3;
                  uVar11 = puVar3[2];
                  lVar46 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x20);
                  *(undefined4 *)(lVar46 + lVar27) = *puVar2;
                  *(undefined4 *)(lVar35 + lVar46 + lVar27) = uVar63;
                  lVar46 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x28);
                  *(undefined4 *)(lVar46 + lVar27) = uVar58;
                  *(undefined4 *)(lVar35 + lVar46 + lVar27) = uVar55;
                  lVar46 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x30);
                  *(int *)(lVar46 + lVar27) = auVar71._0_4_;
                  uVar8 = extractps(auVar71,2);
                  *(undefined8 *)(lVar35 + lVar46 + lVar27) = uVar8;
                  lVar46 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x38);
                  *(undefined4 *)(lVar46 + lVar27) = uVar60;
                  *(undefined4 *)(lVar35 + lVar46 + lVar27) = uVar11;
                  lVar27 = lVar27 + 4;
                } while ((ulong)(uVar28 + (uVar28 == 0)) << 2 != lVar27);
                iVar39 = (int)uVar40;
                if ((local_1b0 == 0x7fffffffffffffff) ||
                   (auVar84._0_8_ = -(ulong)(lVar31 == 0x7fffffffffffffff),
                   auVar84._8_8_ = -(ulong)(lVar25 == 0x7fffffffffffffff),
                   iVar13 = movmskpd(0xffffffff,auVar84), iVar13 != 0)) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar13 = parasail_result_is_saturated(result);
                iVar14 = 0;
                if (iVar13 == 0) {
                  palVar18 = b;
                  palVar19 = palVar37;
                  palVar17 = b_02;
                  palVar16 = b_01;
                  ptr = b_00;
                  ptr_00 = local_1d0;
                  local_200 = palVar23;
                  palVar12 = local_1d8;
                  if ((iVar39 != iVar33 + -1) &&
                     (palVar18 = local_1d0, palVar19 = b_00, palVar17 = palVar23,
                     palVar16 = local_1d8, ptr = palVar37, ptr_00 = b, local_200 = b_02,
                     palVar12 = b_01, iVar39 == iVar33 + -2)) {
                    local_1c8 = palVar37;
                    palVar18 = local_1c0;
                    palVar17 = local_1f8;
                    palVar16 = local_1f0;
                    ptr = palVar29;
                    local_1f8 = palVar23;
                    local_1c0 = local_1d0;
                    local_1a8 = local_1d8;
                  }
                  local_1f0 = palVar12;
                  lVar59 = 0;
                  if ((uVar32 & 0x7ffffffe) == 0) {
                    iVar14 = 0;
                    iVar33 = 0;
                    iVar13 = 0;
                  }
                  else {
                    uVar32 = 0;
                    lVar21 = 0;
                    do {
                      if ((*palVar18)[uVar32] == local_1b0) {
                        uVar36 = 0;
                        if ((uVar32 & 1) != 0) {
                          uVar36 = uVar28;
                        }
                        uVar36 = uVar36 + ((uint)(uVar32 >> 1) & 0x7fffffff);
                        if ((int)uVar36 < (int)uVar15) {
                          local_138 = (*ptr)[uVar32];
                          lVar21 = (*palVar16)[uVar32];
                          lVar59 = (*palVar17)[uVar32];
                          uVar15 = (ulong)uVar36;
                        }
                      }
                      iVar14 = (int)lVar59;
                      iVar33 = (int)lVar21;
                      uVar36 = (uint)uVar15;
                      uVar32 = uVar32 + 1;
                    } while ((uVar28 & 0x3fffffff) * 2 != (int)uVar32);
                    iVar13 = (int)local_138;
                  }
                }
                else {
                  iVar33 = 0;
                  iVar13 = 0;
                  local_1b0 = 0;
                  iVar39 = 0;
                  uVar36 = 0;
                  palVar18 = local_1d0;
                  palVar19 = b_00;
                  palVar17 = palVar23;
                  palVar16 = local_1d8;
                  ptr = palVar37;
                  ptr_00 = b;
                  local_200 = b_02;
                  local_1f0 = b_01;
                }
                result->score = (int)local_1b0;
                result->end_query = uVar36;
                result->end_ref = iVar39;
                ((result->field_4).stats)->matches = iVar13;
                ((result->field_4).stats)->similar = iVar33;
                ((result->field_4).stats)->length = iVar14;
                parasail_free(palVar17);
                parasail_free(palVar16);
                parasail_free(ptr);
                parasail_free(palVar18);
                parasail_free(b_06);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(local_1f8);
                parasail_free(local_200);
                parasail_free(local_1a8);
                parasail_free(local_1f0);
                parasail_free(local_1c8);
                parasail_free(palVar19);
                parasail_free(local_1c0);
                parasail_free(ptr_00);
                return result;
              }
            } while( true );
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vSaturationCheckMax;
    __m128i vPosLimit;
    int64_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm_set1_epi64x_rpl(INT64_MAX);
    maxp = INT64_MAX - (int64_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    pvHMax    = parasail_memalign___m128i(16, segLen);
    pvHMMax   = parasail_memalign___m128i(16, segLen);
    pvHSMax   = parasail_memalign___m128i(16, segLen);
    pvHLMax   = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i cond_zero;
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi64_rpl(vH_dag, vZero);
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            cond_zero = _mm_cmpeq_epi64(vH, vZero);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)), case1);
            vHM = _mm_andnot_si128(cond_zero, vHM);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)), case1);
            vHS = _mm_andnot_si128(cond_zero, vHS);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne), case1);
            vHL = _mm_andnot_si128(cond_zero, vHL);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, -open, 0);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vHp = _mm_max_epi64_rpl(vHp, vZero);
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_and_si128(
                                    _mm_cmpeq_epi64(vF_ext, vEF_opn),
                                    _mm_cmpgt_epi64_rpl(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT64_MAX
            || _mm_movemask_epi8(_mm_cmpeq_epi64(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int64_t *m = (int64_t*)pvHMMax;
            int64_t *s = (int64_t*)pvHSMax;
            int64_t *l = (int64_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}